

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uInput.cpp
# Opt level: O0

void __thiscall uInputPlus::uInput::__init(uInput *this,uInputSetup *setup)

{
  bool bVar1;
  int iVar2;
  system_error *psVar3;
  int *piVar4;
  error_category *peVar5;
  reference puVar6;
  uint *puVar7;
  int *it_4;
  iterator __end1_1;
  iterator __begin1_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1_1;
  uInputAbsSetup *it_3;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_> *__range2_2;
  key_type local_c4;
  _Self local_c0;
  uint local_b4;
  iterator iStack_b0;
  int it_2;
  iterator __end2_1;
  iterator __begin2_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2_1;
  key_type local_8c;
  _Self local_88;
  uint local_7c;
  iterator iStack_78;
  int it_1;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  key_type local_54;
  _Self local_50;
  uint local_44;
  iterator iStack_40;
  int it;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  uInputSetup *setup_local;
  uInput *this_local;
  
  iVar2 = open("/dev/uinput",0x801);
  this->fd_ = iVar2;
  if (this->fd_ < 0) {
    psVar3 = (system_error *)__cxa_allocate_exception(0x20);
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    peVar5 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(psVar3,iVar2,peVar5,"failed to open uinput device");
    __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&setup->Events);
  iStack_40 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&setup->Events);
  while (bVar1 = std::operator!=(&__end1,&stack0xffffffffffffffc0), bVar1) {
    puVar7 = (uint *)std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    local_44 = *puVar7;
    iVar2 = ioctl(this->fd_,0x40045564,(ulong)local_44);
    if (iVar2 != 0) {
      psVar3 = (system_error *)__cxa_allocate_exception(0x20);
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      peVar5 = (error_category *)std::_V2::system_category();
      std::system_error::system_error(psVar3,iVar2,peVar5,"UI_SET_EVBIT ioctl failed");
      __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  local_54 = 1;
  local_50._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find(&setup->Events,&local_54);
  __range2 = (set<int,_std::less<int>,_std::allocator<int>_> *)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end(&setup->Events);
  bVar1 = std::operator!=(&local_50,(_Self *)&__range2);
  if (bVar1) {
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&setup->Keys);
    iStack_78 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&setup->Keys);
    while (bVar1 = std::operator!=(&__end2,&stack0xffffffffffffff88), bVar1) {
      puVar7 = (uint *)std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      local_7c = *puVar7;
      iVar2 = ioctl(this->fd_,0x40045565,(ulong)local_7c);
      if (iVar2 != 0) {
        psVar3 = (system_error *)__cxa_allocate_exception(0x20);
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        peVar5 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(psVar3,iVar2,peVar5,"UI_SET_EVBIT ioctl failed");
        __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
  }
  local_8c = 2;
  local_88._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find(&setup->Events,&local_8c);
  __range2_1 = (set<int,_std::less<int>,_std::allocator<int>_> *)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end(&setup->Events);
  bVar1 = std::operator!=(&local_88,(_Self *)&__range2_1);
  if (bVar1) {
    __end2_1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&setup->Rels);
    iStack_b0 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&setup->Rels);
    while (bVar1 = std::operator!=(&__end2_1,&stack0xffffffffffffff50), bVar1) {
      puVar7 = (uint *)std::_Rb_tree_const_iterator<int>::operator*(&__end2_1);
      local_b4 = *puVar7;
      iVar2 = ioctl(this->fd_,0x40045566,(ulong)local_b4);
      if (iVar2 != 0) {
        psVar3 = (system_error *)__cxa_allocate_exception(0x20);
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        peVar5 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(psVar3,iVar2,peVar5,"UI_SET_RELBIT ioctl failed");
        __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      std::_Rb_tree_const_iterator<int>::operator++(&__end2_1);
    }
  }
  local_c4 = 3;
  local_c0._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find(&setup->Events,&local_c4);
  __range2_2 = (vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_> *)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end(&setup->Events);
  bVar1 = std::operator!=(&local_c0,(_Self *)&__range2_2);
  if (bVar1) {
    __end2_2 = std::vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>
               ::begin(&setup->AbsSetup);
    it_3 = (uInputAbsSetup *)
           std::vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>::end
                     (&setup->AbsSetup);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_uInputPlus::uInputAbsSetup_*,_std::vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>_>
                               *)&it_3), bVar1) {
      puVar6 = __gnu_cxx::
               __normal_iterator<const_uInputPlus::uInputAbsSetup_*,_std::vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>_>
               ::operator*(&__end2_2);
      iVar2 = ioctl(this->fd_,0x40045567,(ulong)*puVar6->Code);
      if (iVar2 != 0) {
        psVar3 = (system_error *)__cxa_allocate_exception(0x20);
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        peVar5 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(psVar3,iVar2,peVar5,"UI_SET_ABSBIT ioctl failed");
        __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      iVar2 = ioctl(this->fd_,0x401c5504,puVar6);
      if (iVar2 != 0) {
        psVar3 = (system_error *)__cxa_allocate_exception(0x20);
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        peVar5 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(psVar3,iVar2,peVar5,"UI_ABS_SETUP ioctl failed");
        __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      __gnu_cxx::
      __normal_iterator<const_uInputPlus::uInputAbsSetup_*,_std::vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>_>
      ::operator++(&__end2_2);
    }
  }
  __end1_1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&setup->Props);
  it_4 = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&setup->Props);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&it_4), bVar1) {
    puVar7 = (uint *)std::_Rb_tree_const_iterator<int>::operator*(&__end1_1);
    iVar2 = ioctl(this->fd_,0x4004556e,(ulong)*puVar7);
    if (iVar2 != 0) {
      psVar3 = (system_error *)__cxa_allocate_exception(0x20);
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      peVar5 = (error_category *)std::_V2::system_category();
      std::system_error::system_error(psVar3,iVar2,peVar5,"UI_SET_PROPBIT ioctl failed");
      __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    std::_Rb_tree_const_iterator<int>::operator++(&__end1_1);
  }
  iVar2 = ioctl(this->fd_,0x405c5503,setup);
  if (iVar2 != 0) {
    psVar3 = (system_error *)__cxa_allocate_exception(0x20);
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    peVar5 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(psVar3,iVar2,peVar5,"UI_DEV_SETUP ioctl failed");
    __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  iVar2 = ioctl(this->fd_,0x5501);
  if (iVar2 == 0) {
    return;
  }
  psVar3 = (system_error *)__cxa_allocate_exception(0x20);
  piVar4 = __errno_location();
  iVar2 = *piVar4;
  peVar5 = (error_category *)std::_V2::system_category();
  std::system_error::system_error(psVar3,iVar2,peVar5,"UI_DEV_CREATE ioctl failed");
  __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void uInput::__init(const uInputSetup &setup) {
	fd_ = open("/dev/uinput", O_WRONLY | O_NONBLOCK);

	if (fd_ < 0)
		throw std::system_error(errno, std::system_category(), "failed to open uinput device");

	for (auto it : setup.Events) {
		if (ioctl(fd_, UI_SET_EVBIT, it))
			throw std::system_error(errno, std::system_category(), "UI_SET_EVBIT ioctl failed");
	}

	if (setup.Events.find(EV_KEY) != setup.Events.end()) {
		for (auto it : setup.Keys) {
			if (ioctl(fd_, UI_SET_KEYBIT, it))
				throw std::system_error(errno, std::system_category(), "UI_SET_EVBIT ioctl failed");
		}
	}

	if (setup.Events.find(EV_REL) != setup.Events.end()) {
		for (auto it : setup.Rels) {
			if (ioctl(fd_, UI_SET_RELBIT, it))
				throw std::system_error(errno, std::system_category(), "UI_SET_RELBIT ioctl failed");
		}
	}


//	uinput_abs_setup s1, s2, s3, s4;
//
//	memset(&s1, 0, sizeof(uinput_abs_setup));
//	memset(&s2, 0, sizeof(uinput_abs_setup));
//	memset(&s3, 0, sizeof(uinput_abs_setup));
//	memset(&s4, 0, sizeof(uinput_abs_setup));
//
//	s1.code = ABS_MT_POSITION_X;
//	s2.code = ABS_MT_POSITION_Y;
//	s3.code = ABS_MT_SLOT;
//	s4.code = ABS_MT_TRACKING_ID;
//
//	s1.absinfo.maximum = s2.absinfo.maximum = 4000;
//	s3.absinfo.maximum = 5;
//	s4.absinfo.maximum = 65535;
//
//	ioctl(FD, UI_ABS_SETUP, &s1);
//	ioctl(FD, UI_ABS_SETUP, &s2);
//	ioctl(FD, UI_ABS_SETUP, &s3);
//	ioctl(FD, UI_ABS_SETUP, &s4);


	if (setup.Events.find(EV_ABS) != setup.Events.end()) {

		for (auto &it : setup.AbsSetup) {
			if (ioctl(fd_, UI_SET_ABSBIT, it.Code))
				throw std::system_error(errno, std::system_category(), "UI_SET_ABSBIT ioctl failed");

			if (ioctl(fd_, UI_ABS_SETUP, &(it.setup)))
				throw std::system_error(errno, std::system_category(), "UI_ABS_SETUP ioctl failed");
		}
	}

	for (auto &it : setup.Props) {
		if (ioctl(fd_, UI_SET_PROPBIT, it))
			throw std::system_error(errno, std::system_category(), "UI_SET_PROPBIT ioctl failed");
	}

	if (ioctl(fd_, UI_DEV_SETUP, &(setup.DeviceInfo.usetup)))
		throw std::system_error(errno, std::system_category(), "UI_DEV_SETUP ioctl failed");

	if (ioctl(fd_, UI_DEV_CREATE))
		throw std::system_error(errno, std::system_category(), "UI_DEV_CREATE ioctl failed");

}